

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  ImFont *pIVar1;
  ImWchar *glyph_ranges;
  ImFontConfig IStack_98;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&IStack_98,0,0x88);
    IStack_98.FontDataOwnedByAtlas = true;
    IStack_98.GlyphMaxAdvanceX = 3.4028235e+38;
    IStack_98.RasterizerMultiply = 1.0;
    IStack_98.EllipsisChar = 0xffff;
    IStack_98.OversampleH = 1;
    IStack_98.OversampleV = 1;
    IStack_98.PixelSnapH = true;
  }
  else {
    memcpy(&IStack_98,font_cfg_template,0x88);
    if (0.0 < IStack_98.SizePixels) goto LAB_0012d5c8;
  }
  IStack_98.SizePixels = 13.0;
LAB_0012d5c8:
  if (IStack_98.Name[0] == '\0') {
    ImFormatString(IStack_98.Name,0x28,"ProggyClean.ttf, %dpx",
                   (ulong)(uint)(int)IStack_98.SizePixels);
  }
  IStack_98.EllipsisChar = 0x85;
  IStack_98.GlyphOffset.y = (float)(int)(IStack_98.SizePixels / 13.0);
  glyph_ranges = GetGlyphRangesDefault::ranges;
  if (IStack_98.GlyphRanges != (ImWchar *)0x0) {
    glyph_ranges = IStack_98.GlyphRanges;
  }
  pIVar1 = AddFontFromMemoryCompressedBase85TTF
                     (this,
                      "7])#######hV0qs\'/###[),##/l:$#Q6>##5[n42>c-TH`->>#/e>11NNV=Bv(*:.F?uu#(gRU.o0XGH`$vhLG1hxt9?W`#,5LsCp#-i>.r$<$6pD>Lb\';9Crc6tgXmKVeU2cD4Eo3R/2*>]b(MC;$jPfY.;h^`IWM9<Lh2TlS+f-s$o6Q<BWH`YiU.xfLq$N;$0iR/GX:U(jcW2p/W*q?-qmnUCI;jHSAiFWM.R*kU@C=GH?a9wp8f$e.-4^Qg1)Q-GL(lf(r/7GrRgwV%MS=C#`8ND>Qo#t\'X#(v#Y9w0#1D$CIf;W\'#pWUPXOuxXuU(H9M(1<q-UE31#^-V\'8IRUo7Qf./L>=Ke$$\'5F%)]0^#0X@U.a<r:QLtFsLcL6##lOj)#.Y5<-R&KgLwqJfLgN&;Q?gI^#DY2uLi@^rMl9t=cWq6##weg>$FBjVQTSDgEKnIS7EM9>ZY9w0#L;>>#Mx&4Mvt//L[MkA#W@lK.N\'[0#7RL_&#w+F%HtG9M#XL`N&.,GM4Pg;-<nLENhvx>-VsM.M0rJfLH2eTM`*oJMHRC`NkfimM2J,W-jXS:)r0wK#@Fge$U>`w\'N7G#$#fB#$E^$#:9:hk+eOe--6x)F7*E%?76%^GMHePW-Z5l\'&GiF#$956:rS?dA#fiK:)Yr+`&#0j@\'DbG&#^$PG.Ll+DNa<XCMKEV*N)LN/N*b=%Q6pia-Xg8I$<MR&,VdJe$<(7G;Ckl\'&hF;;$<_=X(b.RS%%)###MPBuuE1V:v&cX&#2m#(&cV]`k9OhLMbn%s$G2,B$BfD3X*sp5#l,$R#]x_X1xKX%b5U*[r5iMfUo9U`N99hG)tm+/Us9pG)XPu`<0s-)WTt(gCRxIg(%6sfh=ktMKn3j)<6<b5Sk_/0(^]AaN#(p/L>&VZ>1i%h1S9u5o@YaaW$e+b<TWFn/Z:Oh(Cx2$lNEoN^e)#CFY@@I;BOQ*sRwZtZxRcU7uW6CXow0i(?$Q[cjOd[P4d)]>ROPOpxTO7Stwi1::iB1q)C_=dV26J;2,]7op$]uQr@_V7$q^%lQwtuHY]=DX,n3L#0PHDO4f9>dC@O>HBuKPpP*E,N+b3L#lpR/MrTEH.IAQk.a>D[.e;mc.x]Ip.PH^\'/aqUO/$1WxLoW0[iLA<QT;5HKD+@qQ\'NQ(3_PLhE48R.qAPSwQ0/WK?Z,[x?-J;jQTWA0X@KJ(_Y8N-:/M74:/-ZpKrUss?d#dZq]DAbkU*JqkL+nwX@@47`5>w=4h(9.`GCRUxHPeR`5Mjol(dUWxZa(>STrPkrJiWx`5U7F#.g*jrohGg`cg:lSTvEY/EV_7H4Q9[Z%cnv;JQYZ5q.l7Zeas:HOIZOB?G<Nald$qs]@]L<J7bR*>gv:[7MI2k).\'2($5FNP&EQ(,)U]W]+fh18.vsai00);D3@4ku5P?DP8aJt+;qUM]=+b\'8@;mViBKx0DE[-auGl8:PJ&Dj+M6OC]O^((##]`0i)drT;-7X`=-H3[igUnPG-NZlo.#k@h#=Ork$m>a>$-?Tm$UV(?#P6YY#\'/###xe7q.73rI3*pP/$1>s9)W,JrM7SN]\'/4C#v$U`0#V.[0>xQsH$fEmPMgY2u7Kh(G%siIfLSoS+MK2eTM$=5,M8p`A.;_R%#u[K#$x4AG8.kK/HSB==-\'Ie/QTtG?-.*^N-4B/ZM_3YlQC7(p7q)&](`6_c)$/*JL(L-^(]$wIM`dPtOdGA,U3:w2M-0<q-]L_?^)1vw\'.,MRsqVr.L;aN&#/EgJ)PBc[-f>+WomX2u7lqM2iEumMTcsF?-aT=Z-97UEnXglEn1K-bnEO`guFt(c%=;Am_Qs@jLooI&NX;]0#j4#F14;gl8-GQpgwhrq8\'=l_f-b49\'UOqkLu7-##oDY2L(te+Mch&gLYtJ,MEtJfLh\'x\'M=$CS-ZZ%P]8bZ>#S?YY#%Q&q\'3^Fw&?D)UDNrocM3A76//oL?#h7gl85[qW/NDOk%16ij;+:1a\'iNIdb-ou8.P*w,v5#EI$TWS>Pot-R*H\'-SEpA:g)f+O$%%`kA#G=8RMmG1..." /* TRUNCATED STRING LITERAL */
                      ,IStack_98.SizePixels,&IStack_98,glyph_ranges);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 13.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "ProggyClean.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_FLOOR(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}